

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::updateFederateMode(Federate *this,Modes newMode)

{
  Modes MVar1;
  long lVar2;
  undefined1 in_AL;
  undefined7 in_register_00000001;
  Modes *pMVar3;
  Modes *pMVar4;
  undefined8 local_28;
  
  lVar2 = CONCAT71(in_register_00000001,in_AL);
  pMVar3 = (Modes *)&local_28;
  MVar1 = (this->currentMode)._M_i;
  LOCK();
  (this->currentMode)._M_i = newMode;
  UNLOCK();
  if ((byte)(newMode - PENDING_INIT) < 5 || MVar1 == newMode) {
    return;
  }
  local_28 = lVar2;
  if (((this->modeUpdateCallback).super__Function_base._M_manager == (_Manager_type)0x0) ||
     (FINISHED < MVar1)) goto LAB_001da771;
  switch(MVar1) {
  default:
    pMVar4 = (Modes *)((long)&local_28 + 7);
    pMVar3 = (Modes *)((long)&local_28 + 6);
    local_28._0_6_ = (undefined6)lVar2;
    local_28 = CONCAT17(newMode,CONCAT16(MVar1,(undefined6)local_28));
    break;
  case PENDING_INIT:
    pMVar4 = (Modes *)((long)&local_28 + 1);
    local_28._2_6_ = (undefined6)((uint7)in_register_00000001 >> 8);
    local_28 = (ulong)CONCAT61(local_28._2_6_,newMode) << 8;
    break;
  case PENDING_EXEC:
    if (newMode != INITIALIZING) {
      std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator()
                (&this->modeUpdateCallback,newMode,INITIALIZING);
    }
    goto LAB_001da771;
  case PENDING_TIME:
  case PENDING_ITERATIVE_TIME:
    if (newMode == EXECUTING) goto LAB_001da771;
    pMVar4 = (Modes *)((long)&local_28 + 3);
    local_28._4_4_ = (undefined4)((uint7)in_register_00000001 >> 0x18);
    local_28._0_4_ = CONCAT13(newMode,(int3)lVar2);
    pMVar3 = (Modes *)((long)&local_28 + 2);
    goto LAB_001da768;
  case PENDING_FINALIZE:
    pMVar4 = (Modes *)((long)&local_28 + 5);
    local_28._6_2_ = (undefined2)((uint7)in_register_00000001 >> 0x28);
    local_28._0_6_ = CONCAT15(newMode,(int5)lVar2);
    pMVar3 = (Modes *)((long)&local_28 + 4);
LAB_001da768:
    *pMVar3 = EXECUTING;
  }
  (*(this->modeUpdateCallback)._M_invoker)((_Any_data *)&this->modeUpdateCallback,pMVar4,pMVar3);
LAB_001da771:
  if (((newMode == EXECUTING) &&
      ((this->executingEntryCallback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     ((MVar1 == PENDING_EXEC || (MVar1 == INITIALIZING)))) {
    (*(this->executingEntryCallback)._M_invoker)((_Any_data *)&this->executingEntryCallback);
  }
  if ((0xfd < (byte)(newMode - PENDING_INIT)) &&
     ((this->cosimulationTerminationCallback).super__Function_base._M_manager != (_Manager_type)0x0)
     ) {
    (*(this->cosimulationTerminationCallback)._M_invoker)
              ((_Any_data *)&this->cosimulationTerminationCallback);
  }
  return;
}

Assistant:

void Federate::updateFederateMode(Modes newMode)
{
    const Modes oldMode = currentMode.load();
    currentMode.store(newMode);
    if (newMode == oldMode) {
        return;
    }
    if (newMode == Modes::PENDING_EXEC || newMode == Modes::PENDING_INIT ||
        newMode == Modes::PENDING_ITERATIVE_TIME || newMode == Modes::PENDING_TIME ||
        newMode == Modes::PENDING_FINALIZE) {
        return;
    }
    if (modeUpdateCallback) {
        switch (oldMode) {
            case Modes::PENDING_ITERATIVE_INIT:
                break;
            case Modes::PENDING_INIT:
                modeUpdateCallback(newMode, Modes::STARTUP);
                break;
            case Modes::PENDING_EXEC:
                if (newMode != Modes::INITIALIZING) {
                    modeUpdateCallback(newMode, Modes::INITIALIZING);
                }
                break;
            case Modes::PENDING_ITERATIVE_TIME:
            case Modes::PENDING_TIME:
                if (newMode != Modes::EXECUTING) {
                    modeUpdateCallback(newMode, Modes::EXECUTING);
                }
                break;
            case Modes::PENDING_FINALIZE:
                modeUpdateCallback(newMode, Modes::EXECUTING);
                break;
            case Modes::FINALIZE:
            case Modes::INITIALIZING:
            case Modes::EXECUTING:
            case Modes::FINISHED:
            case Modes::ERROR_STATE:
            case Modes::STARTUP:
                modeUpdateCallback(newMode, oldMode);
                break;
        }
    }
    if (executingEntryCallback) {
        if (newMode == Modes::EXECUTING &&
            (oldMode == Modes::INITIALIZING || oldMode == Modes::PENDING_EXEC)) {
            executingEntryCallback();
        }
    }
    if (newMode == Modes::FINALIZE || newMode == Modes::ERROR_STATE) {
        if (cosimulationTerminationCallback) {
            cosimulationTerminationCallback();
        }
    }
}